

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O0

void __thiscall
INetwork::AddNeuron(INetwork *this,INeuron *neuronPtr,size_t neuronId,NEURON_TYPE neuronType)

{
  size_t sVar1;
  bool bVar2;
  mapped_type *ppIVar3;
  _Self local_38;
  _Self local_30;
  NEURON_TYPE local_24;
  size_t sStack_20;
  NEURON_TYPE neuronType_local;
  size_t neuronId_local;
  INeuron *neuronPtr_local;
  INetwork *this_local;
  
  local_24 = neuronType;
  sStack_20 = neuronId;
  neuronId_local = (size_t)neuronPtr;
  neuronPtr_local = (INeuron *)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
       ::find(&this->neuronMap,&stack0xffffffffffffffe0);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
       ::end(&this->neuronMap);
  bVar2 = std::operator==(&local_30,&local_38);
  sVar1 = neuronId_local;
  if (bVar2) {
    ppIVar3 = std::
              map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
              ::operator[](&this->neuronMap,&stack0xffffffffffffffe0);
    *ppIVar3 = (mapped_type)sVar1;
    if (local_24 == INPUT) {
      std::vector<INeuron_*,_std::allocator<INeuron_*>_>::push_back
                (&this->input,(value_type *)&neuronId_local);
    }
    else if (local_24 == OUTPUT) {
      std::vector<INeuron_*,_std::allocator<INeuron_*>_>::push_back
                (&this->output,(value_type *)&neuronId_local);
    }
  }
  return;
}

Assistant:

void INetwork::AddNeuron( INeuron *neuronPtr, size_t neuronId, SPIKING_NN::NEURON_TYPE neuronType )
{
    if ( neuronMap.find( neuronId ) == neuronMap.end()) {
        neuronMap[neuronId] = neuronPtr;
        if ( neuronType == SPIKING_NN::NEURON_TYPE::INPUT ) {
            input.push_back( neuronPtr );
        } else if ( neuronType == SPIKING_NN::NEURON_TYPE::OUTPUT ) {
            output.push_back( neuronPtr );
        }
    }
}